

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  
  sVar3 = (context->roots).classType;
  if (supertype == 0) {
    supertype = (context->roots).objectType;
  }
  _Var1 = sysbvm_tuple_isKindOf(context,supertype,sVar3);
  sVar2 = supertype;
  if (!_Var1) {
    _Var1 = sysbvm_type_isDirectSubtypeOf(supertype,(context->roots).typeType);
    if (!_Var1) goto LAB_0013f58d;
    sVar2 = sysbvm_type_getSupertype(supertype);
  }
  sVar3 = sysbvm_tuple_getType(context,sVar2);
LAB_0013f58d:
  sVar3 = sysbvm_type_createAnonymousMetaclass(context,sVar3);
  sVar2 = sysbvm_type_createAnonymousClass(context,supertype,sVar3);
  *(sysbvm_tuple_t *)(sVar3 + 0xf8) = sVar2;
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClassAndMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_tuple_t metaclassSupertype = context->roots.classType;
    sysbvm_tuple_t actualSuperType = supertype;
    if(!supertype)
        actualSuperType = context->roots.objectType;

    if(sysbvm_tuple_isKindOf(context, actualSuperType, context->roots.classType))
        metaclassSupertype = sysbvm_tuple_getType(context, actualSuperType);
    else if(sysbvm_type_isDirectSubtypeOf(actualSuperType, context->roots.typeType))
        metaclassSupertype = sysbvm_tuple_getType(context, sysbvm_type_getSupertype(actualSuperType));

    sysbvm_tuple_t metaclass = sysbvm_type_createAnonymousMetaclass(context, metaclassSupertype);
    sysbvm_tuple_t class = sysbvm_type_createAnonymousClass(context, actualSuperType, metaclass);

    // Link together the class with its metaclass.
    sysbvm_metaclass_t *metaclassObject = (sysbvm_metaclass_t*)metaclass;
    metaclassObject->super.thisType = class;
    return class;
}